

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void REVassoc_terminal_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  EVaction EVar1;
  CMFormat format;
  FMStructDescList client_data_00;
  char *in_RDX;
  EVSimpleHandlerFunc handler;
  FMStructDescList format_list;
  CMFormat f;
  EVaction ret;
  EVassoc_terminal_action_request *request;
  EV_int_response response;
  FMStructDescList in_stack_ffffffffffffffa8;
  CManager_conflict in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  EVstone stone;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  format = CMlookup_format(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format((CManager)0x0,(FMStructDescList)in_stack_ffffffffffffffb0);
  }
  client_data_00 =
       REVPlookup_format_structs
                 ((CManager_conflict)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_RDX);
  stone = (EVstone)((ulong)in_RDX >> 0x20);
  REVPlookup_handler((char *)format);
  EVar1 = EVassoc_terminal_action
                    ((CManager_conflict)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),stone,
                     (FMStructDescList)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                     ,(EVSimpleHandlerFunc)format,client_data_00);
  CMwrite((CMConnection)CONCAT44(EVar1,in_stack_ffffffffffffffc0),format,client_data_00);
  return;
}

Assistant:

static void
REVassoc_terminal_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVassoc_terminal_action_request *request = (EVassoc_terminal_action_request *) data;
    EVaction ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    FMStructDescList format_list = REVPlookup_format_structs(conn->cm, request->format_list);
    EVSimpleHandlerFunc handler = REVPlookup_handler(request->handler);
    ret = EVassoc_terminal_action(cm, request->stone, format_list, handler, NULL);
    response.ret = (int) ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}